

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O3

void __thiscall Catch::XmlReporter::sectionEnded(XmlReporter *this,SectionStats *sectionStats)

{
  pointer pSVar1;
  pointer pcVar2;
  char *pcVar3;
  int iVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  bool bVar6;
  StringRef name;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  StringRef name_03;
  StringRef attribute;
  ScopedElement e;
  ScopedElement local_50;
  pointer local_40 [2];
  _Alloc_hider local_30;
  
  pSVar1 = (this->super_StreamingReporterBase).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->super_StreamingReporterBase).m_sectionStack.
  super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = pSVar1 + -1;
  pcVar2 = pSVar1[-1].name._M_dataplus._M_p;
  paVar5 = &pSVar1[-1].name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar5) {
    operator_delete(pcVar2,paVar5->_M_allocated_capacity + 1);
  }
  iVar4 = this->m_sectionDepth;
  this->m_sectionDepth = iVar4 + -1;
  if (1 < iVar4) {
    local_40[0] = (pointer)&local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"OverallResults","");
    XmlWriter::scopedElement((XmlWriter *)&local_50,(string *)&this->m_xml,(XmlFormatting)local_40);
    if (local_40[0] != (pointer)&local_30) {
      operator_delete(local_40[0],(ulong)(local_30._M_p + 1));
    }
    name.m_size = 9;
    name.m_start = "successes";
    XmlWriter::writeAttribute<unsigned_long,void>
              (local_50.m_writer,name,&(sectionStats->assertions).passed);
    name_00.m_size = 8;
    name_00.m_start = "failures";
    XmlWriter::writeAttribute<unsigned_long,void>
              (local_50.m_writer,name_00,&(sectionStats->assertions).failed);
    name_01.m_size = 0x10;
    name_01.m_start = "expectedFailures";
    XmlWriter::writeAttribute<unsigned_long,void>
              (local_50.m_writer,name_01,&(sectionStats->assertions).failedButOk);
    bVar6 = (sectionStats->assertions).skipped == 0;
    pcVar3 = "world.value() == true";
    if (bVar6) {
      pcVar3 = "hello.value() == false";
    }
    attribute.m_start = pcVar3 + 0x11;
    attribute.m_size = (ulong)bVar6 | 4;
    name_02.m_size = 7;
    name_02.m_start = "skipped";
    XmlWriter::writeAttribute(local_50.m_writer,name_02,attribute);
    iVar4 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)
              ->_vptr_IConfig[0xb])();
    if (iVar4 == 1) {
      name_03.m_size = 0x11;
      name_03.m_start = "durationInSeconds";
      XmlWriter::writeAttribute<double,void>
                (local_50.m_writer,name_03,&sectionStats->durationInSeconds);
    }
    XmlWriter::ScopedElement::~ScopedElement(&local_50);
    XmlWriter::endElement(&this->m_xml,Newline|Indent);
  }
  return;
}

Assistant:

void XmlReporter::sectionEnded( SectionStats const& sectionStats ) {
        StreamingReporterBase::sectionEnded( sectionStats );
        if ( --m_sectionDepth > 0 ) {
            {
                XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResults" );
                e.writeAttribute( "successes"_sr, sectionStats.assertions.passed );
                e.writeAttribute( "failures"_sr, sectionStats.assertions.failed );
                e.writeAttribute( "expectedFailures"_sr, sectionStats.assertions.failedButOk );
                e.writeAttribute( "skipped"_sr, sectionStats.assertions.skipped > 0 );

                if ( m_config->showDurations() == ShowDurations::Always )
                    e.writeAttribute( "durationInSeconds"_sr, sectionStats.durationInSeconds );
            }
            // Ends assertion tag
            m_xml.endElement();
        }
    }